

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzePhiInstruction
          (ScalarEvolutionAnalysis *this,Instruction *phi)

{
  SENode *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  LoopDescriptor *this_00;
  BasicBlock *pBVar7;
  Function *pFVar8;
  ScalarEvolutionAnalysis *pSVar9;
  mapped_type *ppSVar10;
  mapped_type *ppLVar11;
  __uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  *p_Var12;
  SERecurrentNode *this_01;
  pointer pSVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_a8;
  SENode *local_a0;
  SENode *operand_2;
  SENode *operand_1;
  SENode *phi_operand;
  SENode *step_node;
  SENode *local_78;
  SENode *value_node;
  Instruction *value_inst;
  uint32_t local_60;
  uint32_t incoming_label_id;
  uint32_t value_id;
  uint32_t i;
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  phi_node;
  Loop *loop_to_use;
  Loop *loop;
  LoopDescriptor *loop_descriptor;
  Function *function;
  BasicBlock *basic_block;
  DefUseManager *def_use;
  Instruction *phi_local;
  ScalarEvolutionAnalysis *this_local;
  
  def_use = (DefUseManager *)phi;
  phi_local = (Instruction *)this;
  uVar3 = opt::Instruction::NumInOperands(phi);
  if (uVar3 == 4) {
    basic_block = (BasicBlock *)IRContext::get_def_use_mgr(this->context_);
    function = (Function *)IRContext::get_instr_block(this->context_,(Instruction *)def_use);
    loop_descriptor = (LoopDescriptor *)BasicBlock::GetParent((BasicBlock *)function);
    this_00 = IRContext::GetLoopDescriptor(this->context_,(Function *)loop_descriptor);
    loop = (Loop *)this_00;
    if (this_00 == (LoopDescriptor *)0x0) {
      this_local = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
    }
    else {
      uVar3 = BasicBlock::id((BasicBlock *)function);
      loop_to_use = LoopDescriptor::operator[](this_00,uVar3);
      if ((((loop_to_use == (Loop *)0x0) ||
           (pBVar7 = Loop::GetLatchBlock(loop_to_use), pBVar7 == (BasicBlock *)0x0)) ||
          (pBVar7 = Loop::GetPreHeaderBlock(loop_to_use), pBVar7 == (BasicBlock *)0x0)) ||
         (pFVar8 = (Function *)Loop::GetHeaderBlock(loop_to_use), pFVar8 != function)) {
        pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
        ppSVar10 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
        *ppSVar10 = (mapped_type)pSVar9;
        this_local = pSVar9;
      }
      else {
        phi_node._M_t.
        super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
        .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl =
             (__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
              )(__uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                )0x0;
        ppLVar11 = std::
                   map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
                   ::operator[](&this->pretend_equal_,&loop_to_use);
        if (*ppLVar11 == (mapped_type)0x0) {
          phi_node._M_t.
          super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
          .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl =
               (__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
                  )loop_to_use;
        }
        else {
          p_Var12 = (__uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                     *)std::
                       map<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
                       ::operator[](&this->pretend_equal_,&loop_to_use);
          phi_node._M_t.
          super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
          .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl =
               *(__uniq_ptr_data<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>,_true,_true>
                 *)&p_Var12->_M_t;
        }
        this_01 = (SERecurrentNode *)::operator_new(0x48);
        SERecurrentNode::SERecurrentNode
                  (this_01,this,
                   (Loop *)phi_node._M_t.
                           super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                           .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>.
                           _M_head_impl);
        std::
        unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
        ::unique_ptr<std::default_delete<spvtools::opt::SERecurrentNode>,void>
                  ((unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
                    *)&value_id,this_01);
        pSVar13 = std::
                  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                  ::get((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                         *)&value_id);
        ppSVar10 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
        *ppSVar10 = &pSVar13->super_SENode;
        for (incoming_label_id = 0; uVar3 = incoming_label_id,
            uVar4 = opt::Instruction::NumInOperands((Instruction *)def_use), uVar3 < uVar4;
            incoming_label_id = incoming_label_id + 2) {
          local_60 = opt::Instruction::GetSingleWordInOperand
                               ((Instruction *)def_use,incoming_label_id);
          value_inst._4_4_ =
               opt::Instruction::GetSingleWordInOperand
                         ((Instruction *)def_use,incoming_label_id + 1);
          value_node = (SENode *)
                       analysis::DefUseManager::GetDef((DefUseManager *)basic_block,local_60);
          local_78 = AnalyzeInstruction(this,(Instruction *)value_node);
          bVar2 = SENode::IsCantCompute(local_78);
          uVar3 = value_inst._4_4_;
          if (bVar2) {
            pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
            ppSVar10 = std::
                       map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                       ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
            *ppSVar10 = (mapped_type)pSVar9;
            this_local = pSVar9;
            goto LAB_00a29694;
          }
          pBVar7 = Loop::GetPreHeaderBlock(loop_to_use);
          uVar5 = BasicBlock::id(pBVar7);
          uVar4 = value_inst._4_4_;
          if (uVar3 == uVar5) {
            pSVar13 = std::
                      unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                      ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                    *)&value_id);
            SERecurrentNode::AddOffset(pSVar13,local_78);
          }
          else {
            pBVar7 = Loop::GetLatchBlock(loop_to_use);
            uVar3 = BasicBlock::id(pBVar7);
            if (uVar4 == uVar3) {
              iVar6 = (**local_78->_vptr_SENode)();
              if (iVar6 != 2) {
                pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
                ppSVar10 = std::
                           map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                           ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
                *ppSVar10 = (mapped_type)pSVar9;
                this_local = pSVar9;
                goto LAB_00a29694;
              }
              phi_operand = (SENode *)0x0;
              operand_1 = (SENode *)0x0;
              operand_2 = SENode::GetChild(local_78,0);
              local_a0 = SENode::GetChild(local_78,1);
              iVar6 = (*operand_2->_vptr_SENode[6])();
              if (CONCAT44(extraout_var,iVar6) == 0) {
                phi_operand = operand_2;
              }
              else {
                iVar6 = (*local_a0->_vptr_SENode[6])();
                if (CONCAT44(extraout_var_00,iVar6) == 0) {
                  phi_operand = local_a0;
                }
              }
              iVar6 = (*operand_2->_vptr_SENode[6])();
              if (CONCAT44(extraout_var_01,iVar6) == 0) {
                iVar6 = (*local_a0->_vptr_SENode[6])();
                if (CONCAT44(extraout_var_02,iVar6) != 0) {
                  operand_1 = local_a0;
                }
              }
              else {
                operand_1 = operand_2;
              }
              pSVar1 = operand_1;
              if ((phi_operand == (SENode *)0x0) || (operand_1 == (SENode *)0x0)) {
                pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
                ppSVar10 = std::
                           map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                           ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
                *ppSVar10 = (mapped_type)pSVar9;
                this_local = pSVar9;
                goto LAB_00a29694;
              }
              pSVar13 = std::
                        unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                        ::get((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                               *)&value_id);
              if ((pointer)pSVar1 != pSVar13) {
                pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
                ppSVar10 = std::
                           map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                           ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
                *ppSVar10 = (mapped_type)pSVar9;
                this_local = pSVar9;
                goto LAB_00a29694;
              }
              bVar2 = IsLoopInvariant(this,loop_to_use,phi_operand);
              if (!bVar2) {
                pSVar9 = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
                ppSVar10 = std::
                           map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                           ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
                *ppSVar10 = (mapped_type)pSVar9;
                this_local = pSVar9;
                goto LAB_00a29694;
              }
              pSVar13 = std::
                        unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                        ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                      *)&value_id);
              SERecurrentNode::AddCoefficient(pSVar13,phi_operand);
            }
          }
        }
        std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
        unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>,void>
                  ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                   &local_a8,
                   (unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                    *)&value_id);
        pSVar9 = (ScalarEvolutionAnalysis *)GetCachedOrAdd(this,&local_a8);
        ppSVar10 = std::
                   map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
                   ::operator[](&this->recurrent_node_map_,(key_type *)&def_use);
        *ppSVar10 = (mapped_type)pSVar9;
        this_local = pSVar9;
        std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
        ~unique_ptr(&local_a8);
LAB_00a29694:
        step_node._4_4_ = 1;
        std::
        unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                       *)&value_id);
      }
    }
  }
  else {
    this_local = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzePhiInstruction(const Instruction* phi) {
  // The phi should only have two incoming value pairs.
  if (phi->NumInOperands() != 4) {
    return CreateCantComputeNode();
  }

  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  // Get the basic block this instruction belongs to.
  BasicBlock* basic_block =
      context_->get_instr_block(const_cast<Instruction*>(phi));

  // And then the function that the basic blocks belongs to.
  Function* function = basic_block->GetParent();

  // Use the function to get the loop descriptor.
  LoopDescriptor* loop_descriptor = context_->GetLoopDescriptor(function);

  // We only handle phis in loops at the moment.
  if (!loop_descriptor) return CreateCantComputeNode();

  // Get the innermost loop which this block belongs to.
  Loop* loop = (*loop_descriptor)[basic_block->id()];

  // If the loop doesn't exist or doesn't have a preheader or latch block, exit
  // out.
  if (!loop || !loop->GetLatchBlock() || !loop->GetPreHeaderBlock() ||
      loop->GetHeaderBlock() != basic_block)
    return recurrent_node_map_[phi] = CreateCantComputeNode();

  const Loop* loop_to_use = nullptr;
  if (pretend_equal_[loop]) {
    loop_to_use = pretend_equal_[loop];
  } else {
    loop_to_use = loop;
  }
  std::unique_ptr<SERecurrentNode> phi_node{
      new SERecurrentNode(this, loop_to_use)};

  // We add the node to this map to allow it to be returned before the node is
  // fully built. This is needed as the subsequent call to AnalyzeInstruction
  // could lead back to this |phi| instruction so we return the pointer
  // immediately in AnalyzeInstruction to break the recursion.
  recurrent_node_map_[phi] = phi_node.get();

  // Traverse the operands of the instruction an create new nodes for each one.
  for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
    uint32_t value_id = phi->GetSingleWordInOperand(i);
    uint32_t incoming_label_id = phi->GetSingleWordInOperand(i + 1);

    Instruction* value_inst = def_use->GetDef(value_id);
    SENode* value_node = AnalyzeInstruction(value_inst);

    // If any operand is CantCompute then the whole graph is CantCompute.
    if (value_node->IsCantCompute())
      return recurrent_node_map_[phi] = CreateCantComputeNode();

    // If the value is coming from the preheader block then the value is the
    // initial value of the phi.
    if (incoming_label_id == loop->GetPreHeaderBlock()->id()) {
      phi_node->AddOffset(value_node);
    } else if (incoming_label_id == loop->GetLatchBlock()->id()) {
      // Assumed to be in the form of step + phi.
      if (value_node->GetType() != SENode::Add)
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      SENode* step_node = nullptr;
      SENode* phi_operand = nullptr;
      SENode* operand_1 = value_node->GetChild(0);
      SENode* operand_2 = value_node->GetChild(1);

      // Find which node is the step term.
      if (!operand_1->AsSERecurrentNode())
        step_node = operand_1;
      else if (!operand_2->AsSERecurrentNode())
        step_node = operand_2;

      // Find which node is the recurrent expression.
      if (operand_1->AsSERecurrentNode())
        phi_operand = operand_1;
      else if (operand_2->AsSERecurrentNode())
        phi_operand = operand_2;

      // If it is not in the form step + phi exit out.
      if (!(step_node && phi_operand))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      // If the phi operand is not the same phi node exit out.
      if (phi_operand != phi_node.get())
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      if (!IsLoopInvariant(loop, step_node))
        return recurrent_node_map_[phi] = CreateCantComputeNode();

      phi_node->AddCoefficient(step_node);
    }
  }

  // Once the node is fully built we update the map with the version from the
  // cache (if it has already been added to the cache).
  return recurrent_node_map_[phi] = GetCachedOrAdd(std::move(phi_node));
}